

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

longlong __thiscall SchemePair::list_length(SchemePair *this)

{
  initializer_list<const_SchemePair_*> __l;
  size_t sVar1;
  element_type *peVar2;
  size_type sVar3;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined4 local_8c;
  SchemePair *local_88;
  longlong ans;
  allocator<const_SchemePair_*> local_6a;
  less<const_SchemePair_*> local_69;
  SchemePair *local_68;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  SchemePair *p;
  SchemePair *this_local;
  
  local_60 = &local_68;
  local_58 = 1;
  local_68 = this;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::allocator<const_SchemePair_*>::allocator(&local_6a);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )local_50,__l,&local_69,&local_6a);
  std::allocator<const_SchemePair_*>::~allocator(&local_6a);
  local_88 = (SchemePair *)0x0;
  do {
    sVar1 = visited._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (visited._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      this_local = (SchemePair *)0xffffffffffffffff;
LAB_0014e66f:
      local_8c = 1;
      std::
      set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
      ~set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            *)local_50);
      return (longlong)this_local;
    }
    peVar2 = std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::get
                       (&scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
    if ((element_type *)sVar1 == peVar2) {
      this_local = local_88;
      goto LAB_0014e66f;
    }
    std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&local_a0);
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::get(&local_a0);
    std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)&local_a0);
    sVar3 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::count((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
                     *)local_50,
                    (key_type *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar3 != 0) {
      this_local = (SchemePair *)0xfffffffffffffffe;
      goto LAB_0014e66f;
    }
    std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
    ::insert((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
              *)local_50,(value_type *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_88 = (SchemePair *)((long)&(local_88->super_SchemeObject)._vptr_SchemeObject + 1);
  } while( true );
}

Assistant:

long long SchemePair::list_length() const
{
    const SchemePair *p = this;
    std::set<const SchemePair*> visited{p};
    for(long long ans=0;;++ans)
    {
        if(!p)
            return -1;
        if(p == scheme_nil.get())
            return ans;
        p = std::dynamic_pointer_cast<SchemePair>(p->cdr).get();
        if(visited.count(p))
            return -2;
        visited.insert(p);
    }
}